

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O1

void Res_SimAdjust(Res_Sim_t *p,Abc_Ntk_t *pAig,int nTruePis)

{
  int iVar1;
  int iVar2;
  void **ppvVar3;
  void **ppvVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  srand(0xabc);
  if (pAig->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/res/resSim.c"
                  ,0x54,"void Res_SimAdjust(Res_Sim_t *, Abc_Ntk_t *, int)");
  }
  p->pAig = pAig;
  p->nTruePis = nTruePis;
  pVVar5 = p->vPats;
  if (pVVar5->nSize <= pAig->vObjs->nSize) {
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (void **)0x0;
    }
    if (pVVar5 != (Vec_Ptr_t *)0x0) {
      free(pVVar5);
    }
    lVar9 = (long)pAig->vObjs->nSize;
    uVar8 = lVar9 + 1;
    iVar1 = p->nWordsIn;
    ppvVar3 = (void **)malloc(((long)iVar1 * 4 + 8) * uVar8);
    if (-1 < lVar9) {
      ppvVar4 = ppvVar3 + lVar9 + 1;
      uVar7 = uVar8 & 0xffffffff;
      ppvVar6 = ppvVar3;
      do {
        *ppvVar6 = ppvVar4;
        ppvVar6 = ppvVar6 + 1;
        ppvVar4 = (void **)((long)ppvVar4 + (long)iVar1 * 4);
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nSize = (int)uVar8;
    pVVar5->nCap = (int)uVar8;
    pVVar5->pArray = ppvVar3;
    p->vPats = pVVar5;
  }
  pVVar5 = p->vPats0;
  lVar9 = (long)nTruePis;
  if (pVVar5->nSize < nTruePis) {
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (void **)0x0;
    }
    if (pVVar5 != (Vec_Ptr_t *)0x0) {
      free(pVVar5);
    }
    iVar1 = p->nWords;
    ppvVar3 = (void **)malloc(((long)iVar1 * 4 + 8) * lVar9);
    if (0 < nTruePis) {
      ppvVar6 = ppvVar3 + lVar9;
      uVar8 = (ulong)(uint)nTruePis;
      ppvVar4 = ppvVar3;
      do {
        *ppvVar4 = ppvVar6;
        ppvVar4 = ppvVar4 + 1;
        ppvVar6 = (void **)((long)ppvVar6 + (long)iVar1 * 4);
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nSize = nTruePis;
    pVVar5->nCap = nTruePis;
    pVVar5->pArray = ppvVar3;
    p->vPats0 = pVVar5;
  }
  pVVar5 = p->vPats1;
  if (pVVar5->nSize < nTruePis) {
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (void **)0x0;
    }
    if (pVVar5 != (Vec_Ptr_t *)0x0) {
      free(pVVar5);
    }
    iVar1 = p->nWords;
    ppvVar3 = (void **)malloc(((long)iVar1 * 4 + 8) * lVar9);
    if (0 < nTruePis) {
      ppvVar6 = ppvVar3 + lVar9;
      uVar8 = (ulong)(uint)nTruePis;
      ppvVar4 = ppvVar3;
      do {
        *ppvVar4 = ppvVar6;
        ppvVar4 = ppvVar4 + 1;
        ppvVar6 = (void **)((long)ppvVar6 + (long)iVar1 * 4);
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nSize = nTruePis;
    pVVar5->nCap = nTruePis;
    pVVar5->pArray = ppvVar3;
    p->vPats1 = pVVar5;
  }
  pVVar5 = p->vOuts;
  if (pVVar5->nSize < pAig->vPos->nSize) {
    if (pVVar5->pArray != (void **)0x0) {
      free(pVVar5->pArray);
      pVVar5->pArray = (void **)0x0;
    }
    if (pVVar5 != (Vec_Ptr_t *)0x0) {
      free(pVVar5);
    }
    iVar1 = pAig->vPos->nSize;
    lVar10 = (long)iVar1;
    iVar2 = p->nWordsOut;
    ppvVar3 = (void **)malloc(((long)iVar2 * 4 + 8) * lVar10);
    if (0 < lVar10) {
      ppvVar6 = ppvVar3 + lVar10;
      ppvVar4 = ppvVar3;
      do {
        *ppvVar4 = ppvVar6;
        ppvVar4 = ppvVar4 + 1;
        ppvVar6 = (void **)((long)ppvVar6 + (long)iVar2 * 4);
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    pVVar5 = (Vec_Ptr_t *)malloc(0x10);
    pVVar5->nSize = iVar1;
    pVVar5->nCap = iVar1;
    pVVar5->pArray = ppvVar3;
    p->vOuts = pVVar5;
  }
  if (0 < p->vPats0->nSize) {
    memset(*p->vPats0->pArray,0,p->nWords * lVar9 * 4);
    if (0 < p->vPats1->nSize) {
      memset(*p->vPats1->pArray,0,p->nWords * lVar9 * 4);
      p->nPats0 = 0;
      p->nPats1 = 0;
      p->fConst0 = 0;
      p->fConst1 = 0;
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Res_SimAdjust( Res_Sim_t * p, Abc_Ntk_t * pAig, int nTruePis )
{
    srand( 0xABC );

    assert( Abc_NtkIsStrash(pAig) );
    p->pAig = pAig;
    p->nTruePis = nTruePis;
    if ( Vec_PtrSize(p->vPats) < Abc_NtkObjNumMax(pAig)+1 )
    {
        Vec_PtrFree( p->vPats );
        p->vPats = Vec_PtrAllocSimInfo( Abc_NtkObjNumMax(pAig)+1, p->nWordsIn );
    }
    if ( Vec_PtrSize(p->vPats0) < nTruePis )
    {
        Vec_PtrFree( p->vPats0 );
        p->vPats0 = Vec_PtrAllocSimInfo( nTruePis, p->nWords );
    }
    if ( Vec_PtrSize(p->vPats1) < nTruePis )
    {
        Vec_PtrFree( p->vPats1 );
        p->vPats1 = Vec_PtrAllocSimInfo( nTruePis, p->nWords );
    }
    if ( Vec_PtrSize(p->vOuts) < Abc_NtkPoNum(pAig) )
    {
        Vec_PtrFree( p->vOuts );
        p->vOuts = Vec_PtrAllocSimInfo( Abc_NtkPoNum(pAig), p->nWordsOut );
    }
    // clean storage info for patterns
    Abc_InfoClear( (unsigned *)Vec_PtrEntry(p->vPats0,0), p->nWords * nTruePis );
    Abc_InfoClear( (unsigned *)Vec_PtrEntry(p->vPats1,0), p->nWords * nTruePis );
    p->nPats0 = 0;
    p->nPats1 = 0;
    p->fConst0 = 0;
    p->fConst1 = 0;
}